

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::UpdateOffset(Element *this)

{
  Position PVar1;
  ComputedValues *this_00;
  Box *pBVar2;
  LengthPercentageAuto LVar3;
  Box *pBVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector2f VVar8;
  Vector2f VVar9;
  Type local_c8;
  Type local_b8;
  Type local_a8;
  Type local_98;
  float local_90;
  float fStack_8c;
  Vector2f containing_block_1;
  Box *parent_box_1;
  Type local_70;
  Type local_60;
  float local_58;
  Type local_48;
  Type local_38;
  float local_30;
  float fStack_2c;
  Vector2f containing_block;
  Box *parent_box;
  Position position_property;
  ComputedValues *computed;
  Element *this_local;
  
  this_00 = &this->meta->computed_values;
  PVar1 = Style::ComputedValues::position(this_00);
  if ((PVar1 == Absolute) || (PVar1 == Fixed)) {
    if (this->offset_parent != (Element *)0x0) {
      pBVar2 = GetBox(this->offset_parent);
      VVar8 = Box::GetSize(pBVar2,Padding);
      LVar3 = Style::ComputedValues::left(this_00);
      local_38 = LVar3.type;
      local_30 = VVar8.x;
      if (local_38 == Auto) {
        LVar3 = Style::ComputedValues::right(this_00);
        local_48 = LVar3.type;
        if (local_48 != Auto) {
          fVar5 = Box::GetEdge(pBVar2,Border,Left);
          LVar3 = Style::ComputedValues::right(this_00);
          fVar6 = ResolveValue(LVar3,local_30);
          pBVar4 = GetBox(this);
          VVar9 = Box::GetSize(pBVar4,Border);
          local_58 = VVar9.x;
          pBVar4 = GetBox(this);
          fVar7 = Box::GetEdge(pBVar4,Margin,Right);
          (this->relative_offset_base).x = (local_30 + fVar5) - (fVar6 + local_58 + fVar7);
        }
      }
      else {
        fVar5 = Box::GetEdge(pBVar2,Border,Left);
        LVar3 = Style::ComputedValues::left(this_00);
        fVar6 = ResolveValue(LVar3,local_30);
        pBVar4 = GetBox(this);
        fVar7 = Box::GetEdge(pBVar4,Margin,Left);
        (this->relative_offset_base).x = fVar5 + fVar6 + fVar7;
      }
      LVar3 = Style::ComputedValues::top(this_00);
      local_60 = LVar3.type;
      fStack_2c = VVar8.y;
      if (local_60 == Auto) {
        LVar3 = Style::ComputedValues::bottom(this_00);
        local_70 = LVar3.type;
        if (local_70 != Auto) {
          fVar5 = Box::GetEdge(pBVar2,Border,Top);
          LVar3 = Style::ComputedValues::bottom(this_00);
          fVar6 = ResolveValue(LVar3,fStack_2c);
          pBVar2 = GetBox(this);
          VVar8 = Box::GetSize(pBVar2,Border);
          parent_box_1._4_4_ = VVar8.y;
          pBVar2 = GetBox(this);
          fVar7 = Box::GetEdge(pBVar2,Margin,Bottom);
          (this->relative_offset_base).y =
               (fStack_2c + fVar5) - (fVar6 + parent_box_1._4_4_ + fVar7);
        }
      }
      else {
        fVar5 = Box::GetEdge(pBVar2,Border,Top);
        LVar3 = Style::ComputedValues::top(this_00);
        fVar6 = ResolveValue(LVar3,fStack_2c);
        pBVar2 = GetBox(this);
        fVar7 = Box::GetEdge(pBVar2,Margin,Top);
        (this->relative_offset_base).y = fVar5 + fVar6 + fVar7;
      }
    }
  }
  else if (PVar1 == Relative) {
    if (this->offset_parent != (Element *)0x0) {
      pBVar2 = GetBox(this->offset_parent);
      VVar8 = Box::GetSize(pBVar2);
      LVar3 = Style::ComputedValues::left(this_00);
      local_98 = LVar3.type;
      local_90 = VVar8.x;
      if (local_98 == Auto) {
        LVar3 = Style::ComputedValues::right(this_00);
        local_a8 = LVar3.type;
        if (local_a8 == Auto) {
          (this->relative_offset_position).x = 0.0;
        }
        else {
          LVar3 = Style::ComputedValues::right(this_00);
          fVar5 = ResolveValue(LVar3,local_90);
          (this->relative_offset_position).x = fVar5 * -1.0;
        }
      }
      else {
        LVar3 = Style::ComputedValues::left(this_00);
        fVar5 = ResolveValue(LVar3,local_90);
        (this->relative_offset_position).x = fVar5;
      }
      LVar3 = Style::ComputedValues::top(this_00);
      local_b8 = LVar3.type;
      fStack_8c = VVar8.y;
      if (local_b8 == Auto) {
        LVar3 = Style::ComputedValues::bottom(this_00);
        local_c8 = LVar3.type;
        if (local_c8 == Auto) {
          (this->relative_offset_position).y = 0.0;
        }
        else {
          LVar3 = Style::ComputedValues::bottom(this_00);
          fVar5 = ResolveValue(LVar3,fStack_8c);
          (this->relative_offset_position).y = fVar5 * -1.0;
        }
      }
      else {
        LVar3 = Style::ComputedValues::top(this_00);
        fVar5 = ResolveValue(LVar3,fStack_8c);
        (this->relative_offset_position).y = fVar5;
      }
    }
  }
  else {
    (this->relative_offset_position).x = 0.0;
    (this->relative_offset_position).y = 0.0;
  }
  return;
}

Assistant:

void Element::UpdateOffset()
{
	using namespace Style;
	const auto& computed = meta->computed_values;
	Position position_property = computed.position();

	if (position_property == Position::Absolute || position_property == Position::Fixed)
	{
		if (offset_parent != nullptr)
		{
			const Box& parent_box = offset_parent->GetBox();
			Vector2f containing_block = parent_box.GetSize(BoxArea::Padding);

			// If the element is anchored left, then the position is offset by that resolved value.
			if (computed.left().type != Left::Auto)
				relative_offset_base.x = parent_box.GetEdge(BoxArea::Border, BoxEdge::Left) +
					(ResolveValue(computed.left(), containing_block.x) + GetBox().GetEdge(BoxArea::Margin, BoxEdge::Left));

			// If the element is anchored right, then the position is set first so the element's right-most edge
			// (including margins) will render up against the containing box's right-most content edge, and then
			// offset by the resolved value.
			else if (computed.right().type != Right::Auto)
			{
				relative_offset_base.x = containing_block.x + parent_box.GetEdge(BoxArea::Border, BoxEdge::Left) -
					(ResolveValue(computed.right(), containing_block.x) + GetBox().GetSize(BoxArea::Border).x +
						GetBox().GetEdge(BoxArea::Margin, BoxEdge::Right));
			}

			// If the element is anchored top, then the position is offset by that resolved value.
			if (computed.top().type != Top::Auto)
			{
				relative_offset_base.y = parent_box.GetEdge(BoxArea::Border, BoxEdge::Top) +
					(ResolveValue(computed.top(), containing_block.y) + GetBox().GetEdge(BoxArea::Margin, BoxEdge::Top));
			}

			// If the element is anchored bottom, then the position is set first so the element's right-most edge
			// (including margins) will render up against the containing box's right-most content edge, and then
			// offset by the resolved value.
			else if (computed.bottom().type != Bottom::Auto)
			{
				relative_offset_base.y = containing_block.y + parent_box.GetEdge(BoxArea::Border, BoxEdge::Top) -
					(ResolveValue(computed.bottom(), containing_block.y) + GetBox().GetSize(BoxArea::Border).y +
						GetBox().GetEdge(BoxArea::Margin, BoxEdge::Bottom));
			}
		}
	}
	else if (position_property == Position::Relative)
	{
		if (offset_parent != nullptr)
		{
			const Box& parent_box = offset_parent->GetBox();
			Vector2f containing_block = parent_box.GetSize();

			if (computed.left().type != Left::Auto)
				relative_offset_position.x = ResolveValue(computed.left(), containing_block.x);
			else if (computed.right().type != Right::Auto)
				relative_offset_position.x = -1 * ResolveValue(computed.right(), containing_block.x);
			else
				relative_offset_position.x = 0;

			if (computed.top().type != Top::Auto)
				relative_offset_position.y = ResolveValue(computed.top(), containing_block.y);
			else if (computed.bottom().type != Bottom::Auto)
				relative_offset_position.y = -1 * ResolveValue(computed.bottom(), containing_block.y);
			else
				relative_offset_position.y = 0;
		}
	}
	else
	{
		relative_offset_position.x = 0;
		relative_offset_position.y = 0;
	}
}